

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O3

void __thiscall
wasm::PassRunner::doAdd
          (PassRunner *this,unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass)

{
  Pass *pPVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  
  iVar3 = (*((pass->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
             super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->_vptr_Pass[7])();
  if ((char)iVar3 != '\0') {
    bVar2 = Debug::shouldPreserveDWARF(&this->options,this->wasm);
    if ((bVar2) && ((this->addedPassesRemovedDWARF & 1U) == 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"warning: running pass \'",0x17);
      pPVar1 = (pass->_M_t).super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t
               .super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
               super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl;
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(pPVar1->name)._M_dataplus._M_p,
                          (pPVar1->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,"\' which is not fully compatible with DWARF\n",0x2b);
    }
  }
  bVar2 = passRemovesDebugInfo
                    (&((pass->_M_t).
                       super___uniq_ptr_impl<wasm::Pass,_std::default_delete<wasm::Pass>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Pass_*,_std::default_delete<wasm::Pass>_>.
                       super__Head_base<0UL,_wasm::Pass_*,_false>._M_head_impl)->name);
  if (bVar2) {
    this->addedPassesRemovedDWARF = true;
  }
  std::
  vector<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>,std::allocator<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>>>
  ::emplace_back<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>>
            ((vector<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>,std::allocator<std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>>>
              *)&this->passes,pass);
  return;
}

Assistant:

void PassRunner::doAdd(std::unique_ptr<Pass> pass) {
  if (pass->invalidatesDWARF() && shouldPreserveDWARF()) {
    std::cerr << "warning: running pass '" << pass->name
              << "' which is not fully compatible with DWARF\n";
  }
  if (passRemovesDebugInfo(pass->name)) {
    addedPassesRemovedDWARF = true;
  }
  passes.emplace_back(std::move(pass));
}